

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_37bab4::MLDSATest_SigGenTests65_Test::~MLDSATest_SigGenTests65_Test
          (MLDSATest_SigGenTests65_Test *this)

{
  MLDSATest_SigGenTests65_Test *this_local;
  
  ~MLDSATest_SigGenTests65_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MLDSATest, SigGenTests65) {
  FileTestGTest(
      "crypto/mldsa/mldsa_nist_siggen_65_tests.txt",
      MLDSASigGenTest<BCM_mldsa65_private_key, BCM_mldsa65_public_key,
                      MLDSA65_SIGNATURE_BYTES, BCM_mldsa65_parse_private_key,
                      BCM_mldsa65_sign_internal,
                      BCM_mldsa65_public_from_private,
                      BCM_mldsa65_verify_internal>);
}